

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

void __thiscall cmGlobalNinjaGenerator::WriteFolderTargets(cmGlobalNinjaGenerator *this,ostream *os)

{
  pointer *ppbVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  undefined8 str;
  bool bVar2;
  uint uVar3;
  int iVar4;
  cmMakefile *this_01;
  string *psVar5;
  reference t_00;
  size_type sVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar7;
  undefined4 extraout_var_01;
  reference pvVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_5e0;
  ostream *local_5c8;
  allocator<char> local_559;
  string local_558 [32];
  string local_538 [32];
  value_type local_518;
  reference local_4f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *config_3;
  iterator __end3_3;
  iterator __begin3_3;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3_3;
  reference local_4b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *config_2;
  iterator __end4;
  iterator __begin4;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490;
  iterator local_470;
  size_type local_468;
  undefined1 local_460 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *config_1;
  iterator __end3_2;
  iterator __begin3_2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3_2;
  cmAlphaNum local_410;
  string local_3e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  reference local_3a0;
  Dir *d;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  vector<cmGlobalCommonGenerator::DirectoryTarget::Dir,_std::allocator<cmGlobalCommonGenerator::DirectoryTarget::Dir>_>
  *__range3_1;
  Target *t;
  const_iterator __end3;
  const_iterator __begin3;
  vector<cmGlobalCommonGenerator::DirectoryTarget::Target,_std::allocator<cmGlobalCommonGenerator::DirectoryTarget::Target>_>
  *__range3;
  reference local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *config;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  cmAlphaNum local_2f0;
  string local_2c0;
  string local_2a0 [8];
  string buildDirAllTarget;
  cmAlphaNum local_250;
  string local_220;
  undefined1 local_200 [8];
  cmNinjaDeps configDeps;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  DirectoryTarget *dt;
  string *currentBinaryDir;
  allocator<char> local_1a9;
  string local_1a8;
  undefined1 local_188 [8];
  cmNinjaBuild build;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalCommonGenerator::DirectoryTarget>
  *it;
  iterator __end1;
  iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalCommonGenerator::DirectoryTarget,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalCommonGenerator::DirectoryTarget>_>_>
  *__range1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalCommonGenerator::DirectoryTarget,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalCommonGenerator::DirectoryTarget>_>_>
  dirTargets;
  ostream *os_local;
  cmGlobalNinjaGenerator *this_local;
  
  dirTargets._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)os;
  WriteDivider(os);
  std::operator<<((ostream *)dirTargets._M_t._M_impl.super__Rb_tree_header._M_node_count,
                  "# Folder targets.\n\n");
  cmGlobalCommonGenerator::ComputeDirectoryTargets_abi_cxx11_
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalCommonGenerator::DirectoryTarget,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalCommonGenerator::DirectoryTarget>_>_>
              *)&__range1,&this->super_cmGlobalCommonGenerator);
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalCommonGenerator::DirectoryTarget,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalCommonGenerator::DirectoryTarget>_>_>
           ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalCommonGenerator::DirectoryTarget,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalCommonGenerator::DirectoryTarget>_>_>
                    *)&__range1);
  it = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalCommonGenerator::DirectoryTarget>
        *)std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalCommonGenerator::DirectoryTarget,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalCommonGenerator::DirectoryTarget>_>_>
          ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalCommonGenerator::DirectoryTarget,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalCommonGenerator::DirectoryTarget>_>_>
                 *)&__range1);
  while (bVar2 = std::operator!=(&__end1,(_Self *)&it), bVar2) {
    build.RspFile.field_2._8_8_ =
         std::
         _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalCommonGenerator::DirectoryTarget>_>
         ::operator*(&__end1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8,"phony",&local_1a9);
    cmNinjaBuild::cmNinjaBuild((cmNinjaBuild *)local_188,&local_1a8);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::allocator<char>::~allocator(&local_1a9);
    WriteDivider((ostream *)dirTargets._M_t._M_impl.super__Rb_tree_header._M_node_count);
    str = build.RspFile.field_2._8_8_;
    this_01 = cmLocalGenerator::GetMakefile
                        (*(cmLocalGenerator **)(build.RspFile.field_2._8_8_ + 0x20));
    cmMakefile::GetGeneratorConfigs_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&configDeps.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,this_01,IncludeEmptyConfig);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_200);
    cmAlphaNum::cmAlphaNum(&local_250,"Folder: ");
    cmAlphaNum::cmAlphaNum((cmAlphaNum *)((long)&buildDirAllTarget.field_2 + 8),(string *)str);
    cmStrCat<>(&local_220,&local_250,(cmAlphaNum *)((long)&buildDirAllTarget.field_2 + 8));
    std::__cxx11::string::operator=((string *)local_188,(string *)&local_220);
    std::__cxx11::string::~string((string *)&local_220);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::emplace_back<>((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)((long)&build.Rule.field_2 + 8));
    cmAlphaNum::cmAlphaNum(&local_2f0,(string *)str);
    cmAlphaNum::cmAlphaNum((cmAlphaNum *)&__range2,"/all");
    cmStrCat<>(&local_2c0,&local_2f0,(cmAlphaNum *)&__range2);
    psVar5 = ConvertToNinjaPath(this,&local_2c0);
    std::__cxx11::string::string(local_2a0,(string *)psVar5);
    std::__cxx11::string::~string((string *)&local_2c0);
    ppbVar1 = &configDeps.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)ppbVar1);
    config = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)ppbVar1);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&config), bVar2) {
      local_340 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&__end2);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&build.WorkDirOuts.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[0x48])
                (&__range3,this,local_2a0);
      this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&build.Rule.field_2 + 8);
      pvVar8 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::front(this_00);
      std::__cxx11::string::operator=((string *)pvVar8,(string *)&__range3);
      std::__cxx11::string::~string((string *)&__range3);
      pvVar8 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::front(this_00);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_200,
                 pvVar8);
      __end3 = std::
               vector<cmGlobalCommonGenerator::DirectoryTarget::Target,_std::allocator<cmGlobalCommonGenerator::DirectoryTarget::Target>_>
               ::begin((vector<cmGlobalCommonGenerator::DirectoryTarget::Target,_std::allocator<cmGlobalCommonGenerator::DirectoryTarget::Target>_>
                        *)(str + 0x28));
      t = (Target *)
          std::
          vector<cmGlobalCommonGenerator::DirectoryTarget::Target,_std::allocator<cmGlobalCommonGenerator::DirectoryTarget::Target>_>
          ::end((vector<cmGlobalCommonGenerator::DirectoryTarget::Target,_std::allocator<cmGlobalCommonGenerator::DirectoryTarget::Target>_>
                 *)(str + 0x28));
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<const_cmGlobalCommonGenerator::DirectoryTarget::Target_*,_std::vector<cmGlobalCommonGenerator::DirectoryTarget::Target,_std::allocator<cmGlobalCommonGenerator::DirectoryTarget::Target>_>_>
                                         *)&t), bVar2) {
        t_00 = __gnu_cxx::
               __normal_iterator<const_cmGlobalCommonGenerator::DirectoryTarget::Target_*,_std::vector<cmGlobalCommonGenerator::DirectoryTarget::Target,_std::allocator<cmGlobalCommonGenerator::DirectoryTarget::Target>_>_>
               ::operator*(&__end3);
        bVar2 = cmGlobalCommonGenerator::IsExcludedFromAllInConfig
                          (&this->super_cmGlobalCommonGenerator,t_00,local_340);
        if (!bVar2) {
          AppendTargetOutputs(this,t_00->GT,
                              (cmNinjaDeps *)
                              &build.WorkDirOuts.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,local_340,
                              DependOnTargetArtifact);
        }
        __gnu_cxx::
        __normal_iterator<const_cmGlobalCommonGenerator::DirectoryTarget::Target_*,_std::vector<cmGlobalCommonGenerator::DirectoryTarget::Target,_std::allocator<cmGlobalCommonGenerator::DirectoryTarget::Target>_>_>
        ::operator++(&__end3);
      }
      __end3_1 = std::
                 vector<cmGlobalCommonGenerator::DirectoryTarget::Dir,_std::allocator<cmGlobalCommonGenerator::DirectoryTarget::Dir>_>
                 ::begin((vector<cmGlobalCommonGenerator::DirectoryTarget::Dir,_std::allocator<cmGlobalCommonGenerator::DirectoryTarget::Dir>_>
                          *)(str + 0x40));
      d = (Dir *)std::
                 vector<cmGlobalCommonGenerator::DirectoryTarget::Dir,_std::allocator<cmGlobalCommonGenerator::DirectoryTarget::Dir>_>
                 ::end((vector<cmGlobalCommonGenerator::DirectoryTarget::Dir,_std::allocator<cmGlobalCommonGenerator::DirectoryTarget::Dir>_>
                        *)(str + 0x40));
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end3_1,
                                (__normal_iterator<const_cmGlobalCommonGenerator::DirectoryTarget::Dir_*,_std::vector<cmGlobalCommonGenerator::DirectoryTarget::Dir,_std::allocator<cmGlobalCommonGenerator::DirectoryTarget::Dir>_>_>
                                 *)&d), bVar2) {
        local_3a0 = __gnu_cxx::
                    __normal_iterator<const_cmGlobalCommonGenerator::DirectoryTarget::Dir_*,_std::vector<cmGlobalCommonGenerator::DirectoryTarget::Dir,_std::allocator<cmGlobalCommonGenerator::DirectoryTarget::Dir>_>_>
                    ::operator*(&__end3_1);
        if ((local_3a0->ExcludeFromAll & 1U) == 0) {
          cmAlphaNum::cmAlphaNum(&local_410,&local_3a0->Path);
          cmAlphaNum::cmAlphaNum((cmAlphaNum *)&__range3_2,"/all");
          cmStrCat<>(&local_3e0,&local_410,(cmAlphaNum *)&__range3_2);
          psVar5 = ConvertToNinjaPath(this,&local_3e0);
          (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
            [0x48])(&local_3c0,this,psVar5);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &build.WorkDirOuts.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_3c0);
          std::__cxx11::string::~string((string *)&local_3c0);
          std::__cxx11::string::~string((string *)&local_3e0);
        }
        __gnu_cxx::
        __normal_iterator<const_cmGlobalCommonGenerator::DirectoryTarget::Dir_*,_std::vector<cmGlobalCommonGenerator::DirectoryTarget::Dir,_std::allocator<cmGlobalCommonGenerator::DirectoryTarget::Dir>_>_>
        ::operator++(&__end3_1);
      }
      bVar2 = EnableCrossConfigBuild(this);
      if ((bVar2) &&
         (sVar6 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::count(&this->CrossConfigs,local_340), sVar6 != 0)) {
        local_5c8 = (ostream *)dirTargets._M_t._M_impl.super__Rb_tree_header._M_node_count;
      }
      else {
        iVar4 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                  _vptr_cmGlobalGenerator[0x41])(this,local_340);
        local_5c8 = (ostream *)CONCAT44(extraout_var,iVar4);
      }
      WriteBuild(this,local_5c8,(cmNinjaBuild *)local_188,0,(bool *)0x0);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    uVar3 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
              [0x26])();
    if ((uVar3 & 1) != 0) {
      ppbVar1 = &configDeps.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      __end3_2 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)ppbVar1);
      config_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)ppbVar1);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end3_2,
                                (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&config_1), bVar2) {
        local_460 = (undefined1  [8])
                    __gnu_cxx::
                    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&__end3_2);
        (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
          [0x48])(&local_490,this,local_2a0,local_460);
        local_470 = &local_490;
        local_468 = 1;
        __l._M_len = 1;
        __l._M_array = local_470;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&build.WorkDirOuts.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,__l);
        local_5e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_470;
        do {
          local_5e0 = local_5e0 + -1;
          std::__cxx11::string::~string((string *)local_5e0);
        } while (local_5e0 != &local_490);
        pvVar8 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)((long)&build.Rule.field_2 + 8));
        std::__cxx11::string::operator=((string *)pvVar8,local_2a0);
        iVar4 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                  _vptr_cmGlobalGenerator[0x42])(this,local_460);
        WriteBuild(this,(ostream *)CONCAT44(extraout_var_00,iVar4),(cmNinjaBuild *)local_188,0,
                   (bool *)0x0);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end3_2);
      }
      uVar7 = std::__cxx11::string::empty();
      if ((uVar7 & 1) == 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&build.WorkDirOuts.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        __end4 = std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin(&this->DefaultConfigs);
        config_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::
                   set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end(&this->DefaultConfigs);
        while (bVar2 = std::operator!=(&__end4,(_Self *)&config_2), bVar2) {
          local_4b8 = std::
                      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator*(&__end4);
          (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
            [0x48])(&__range3_3,this,local_2a0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&build.WorkDirOuts.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (value_type *)&__range3_3);
          std::__cxx11::string::~string((string *)&__range3_3);
          std::
          _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator++(&__end4);
        }
        pvVar8 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)((long)&build.Rule.field_2 + 8));
        std::__cxx11::string::operator=((string *)pvVar8,local_2a0);
        iVar4 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                  _vptr_cmGlobalGenerator[0x43])();
        WriteBuild(this,(ostream *)CONCAT44(extraout_var_01,iVar4),(cmNinjaBuild *)local_188,0,
                   (bool *)0x0);
      }
    }
    bVar2 = EnableCrossConfigBuild(this);
    if (bVar2) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&build.WorkDirOuts.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      __end3_3 = std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin(&this->CrossConfigs);
      config_3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end(&this->CrossConfigs);
      while (bVar2 = std::operator!=(&__end3_3,(_Self *)&config_3), bVar2) {
        local_4f8 = std::
                    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator*(&__end3_3);
        (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
          [0x48])(&local_518,this,local_2a0,local_4f8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&build.WorkDirOuts.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_518);
        std::__cxx11::string::~string((string *)&local_518);
        std::
        _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&__end3_3);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_558,"all",&local_559);
      (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[0x48])
                (local_538,this,local_2a0);
      pvVar8 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)((long)&build.Rule.field_2 + 8));
      std::__cxx11::string::operator=((string *)pvVar8,local_538);
      std::__cxx11::string::~string(local_538);
      std::__cxx11::string::~string(local_558);
      std::allocator<char>::~allocator(&local_559);
      WriteBuild(this,(ostream *)dirTargets._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (cmNinjaBuild *)local_188,0,(bool *)0x0);
    }
    std::__cxx11::string::~string(local_2a0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_200);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&configDeps.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)local_188);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalCommonGenerator::DirectoryTarget>_>
    ::operator++(&__end1);
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalCommonGenerator::DirectoryTarget,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalCommonGenerator::DirectoryTarget>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalCommonGenerator::DirectoryTarget,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalCommonGenerator::DirectoryTarget>_>_>
          *)&__range1);
  return;
}

Assistant:

void cmGlobalNinjaGenerator::WriteFolderTargets(std::ostream& os)
{
  cmGlobalNinjaGenerator::WriteDivider(os);
  os << "# Folder targets.\n\n";

  std::map<std::string, DirectoryTarget> dirTargets =
    this->ComputeDirectoryTargets();

  for (auto const& it : dirTargets) {
    cmNinjaBuild build("phony");
    cmGlobalNinjaGenerator::WriteDivider(os);
    std::string const& currentBinaryDir = it.first;
    DirectoryTarget const& dt = it.second;
    std::vector<std::string> configs =
      dt.LG->GetMakefile()->GetGeneratorConfigs(
        cmMakefile::IncludeEmptyConfig);

    // Setup target
    cmNinjaDeps configDeps;
    build.Comment = cmStrCat("Folder: ", currentBinaryDir);
    build.Outputs.emplace_back();
    std::string const buildDirAllTarget =
      this->ConvertToNinjaPath(cmStrCat(currentBinaryDir, "/all"));
    for (auto const& config : configs) {
      build.ExplicitDeps.clear();
      build.Outputs.front() = this->BuildAlias(buildDirAllTarget, config);
      configDeps.emplace_back(build.Outputs.front());
      for (DirectoryTarget::Target const& t : dt.Targets) {
        if (!this->IsExcludedFromAllInConfig(t, config)) {
          this->AppendTargetOutputs(t.GT, build.ExplicitDeps, config,
                                    DependOnTargetArtifact);
        }
      }
      for (DirectoryTarget::Dir const& d : dt.Children) {
        if (!d.ExcludeFromAll) {
          build.ExplicitDeps.emplace_back(this->BuildAlias(
            this->ConvertToNinjaPath(cmStrCat(d.Path, "/all")), config));
        }
      }
      // Write target
      this->WriteBuild(this->EnableCrossConfigBuild() &&
                           this->CrossConfigs.count(config)
                         ? os
                         : *this->GetImplFileStream(config),
                       build);
    }

    // Add shortcut target
    if (this->IsMultiConfig()) {
      for (auto const& config : configs) {
        build.ExplicitDeps = { this->BuildAlias(buildDirAllTarget, config) };
        build.Outputs.front() = buildDirAllTarget;
        this->WriteBuild(*this->GetConfigFileStream(config), build);
      }

      if (!this->DefaultFileConfig.empty()) {
        build.ExplicitDeps.clear();
        for (auto const& config : this->DefaultConfigs) {
          build.ExplicitDeps.push_back(
            this->BuildAlias(buildDirAllTarget, config));
        }
        build.Outputs.front() = buildDirAllTarget;
        this->WriteBuild(*this->GetDefaultFileStream(), build);
      }
    }

    // Add target for all configs
    if (this->EnableCrossConfigBuild()) {
      build.ExplicitDeps.clear();
      for (auto const& config : this->CrossConfigs) {
        build.ExplicitDeps.push_back(
          this->BuildAlias(buildDirAllTarget, config));
      }
      build.Outputs.front() = this->BuildAlias(buildDirAllTarget, "all");
      this->WriteBuild(os, build);
    }
  }
}